

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O2

bool __thiscall QNetworkAccessCache::unlinkEntry(QNetworkAccessCache *this,QByteArray *key)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  
  pNVar3 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::value
                     ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10),key);
  if (pNVar3 == (Node *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = pNVar3 == *(Node **)(this + 0x18);
    if (bVar4) {
      *(Node **)(this + 0x18) = pNVar3->next;
    }
    pNVar1 = pNVar3->previous;
    if (pNVar3 == *(Node **)(this + 0x20)) {
      *(Node **)(this + 0x20) = pNVar1;
    }
    pNVar2 = pNVar3->next;
    if (pNVar1 != (Node *)0x0) {
      pNVar1->next = pNVar2;
    }
    if (pNVar2 != (Node *)0x0) {
      pNVar2->previous = pNVar1;
    }
    pNVar3->previous = (Node *)0x0;
    pNVar3->next = (Node *)0x0;
  }
  return bVar4;
}

Assistant:

bool QNetworkAccessCache::unlinkEntry(const QByteArray &key)
{
    Node * const node = hash.value(key);
    if (!node)
        return false;

    bool wasFirst = false;
    if (node == firstExpiringNode) {
        firstExpiringNode = node->next;
        wasFirst = true;
    }
    if (node == lastExpiringNode)
        lastExpiringNode = node->previous;
    if (node->previous)
        node->previous->next = node->next;
    if (node->next)
        node->next->previous = node->previous;

    node->next = node->previous = nullptr;
    return wasFirst;
}